

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

BindingFrame * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::capture
          (BindingFrame *__return_storage_ptr__,Interpreter *this,
          vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *free_vars)

{
  HeapThunk *pHVar1;
  _Rb_tree_header *p_Var2;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *in_RCX;
  const_iterator __end3;
  Identifier *fv;
  key_type local_38;
  
  p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (free_vars != in_RCX) {
    do {
      local_38 = *(key_type *)free_vars;
      pHVar1 = Stack::lookUpVar((Stack *)(this->stack).stack.
                                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                (Identifier *)
                                (this->stack).stack.
                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
      p_Var2 = (_Rb_tree_header *)
               std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::operator[](__return_storage_ptr__,&local_38);
      *(HeapThunk **)&((_Rep_type *)&p_Var2->_M_header)->_M_impl = pHVar1;
      free_vars = (vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)((long)free_vars + 8);
    } while (free_vars != in_RCX);
  }
  return (BindingFrame *)p_Var2;
}

Assistant:

BindingFrame capture(const std::vector<const Identifier *> &free_vars)
    {
        BindingFrame env;
        for (auto fv : free_vars) {
            auto *th = stack.lookUpVar(fv);
            env[fv] = th;
        }
        return env;
    }